

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enummanager.cpp
# Opt level: O1

Enum * __thiscall camp::detail::EnumManager::getByIndex(EnumManager *this,size_t index)

{
  pointer poVar1;
  pointer *ppoVar2;
  OutOfRange *__return_storage_ptr__;
  undefined1 local_b0 [32];
  string local_90;
  OutOfRange local_70;
  
  if ((this->m_enums).node_count <= index) {
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    OutOfRange::OutOfRange(&local_70,index,(this->m_enums).node_count);
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enummanager.cpp"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "const Enum &camp::detail::EnumManager::getByIndex(std::size_t) const","");
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_70,(string *)local_b0,0x55,&local_90);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
  }
  poVar1 = (((this->m_enums).
             super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
            .member)->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  ppoVar2 = &poVar1[-5].
             super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .super_type.right_;
  if (poVar1 == (pointer)0x0) {
    ppoVar2 = (pointer *)0x0;
  }
  if ((long)index < 1) {
    if (index != 0) {
      do {
        local_b0._0_8_ = ppoVar2 + 0xd;
        boost::multi_index::detail::
        ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
        ::decrement((pointer *)local_b0);
        ppoVar2 = (pointer *)(local_b0._0_8_ + -0x68);
        if ((pointer)local_b0._0_8_ == (pointer)0x0) {
          ppoVar2 = (pointer *)0x0;
        }
        index = index + 1;
      } while (index != 0);
    }
  }
  else {
    do {
      local_b0._0_8_ = ppoVar2 + 0xd;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)local_b0);
      ppoVar2 = (pointer *)(local_b0._0_8_ + -0x68);
      if ((pointer)local_b0._0_8_ == (pointer)0x0) {
        ppoVar2 = (pointer *)0x0;
      }
      index = index - 1;
    } while (index != 0);
  }
  return (Enum *)ppoVar2[8];
}

Assistant:

const Enum& EnumManager::getByIndex(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_enums.size())
        CAMP_ERROR(OutOfRange(index, m_enums.size()));

    EnumTable::const_iterator it = m_enums.begin();
    std::advance(it, index);

    return *it->enumPtr;
}